

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh.c
# Opt level: O1

void Bmc_MeshTest(Gia_Man_t *p,int X,int Y,int T,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  satoko_t *s;
  Gia_Obj_t *pGVar13;
  abctime aVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  abctime time;
  int iVar18;
  int iVar19;
  uint uVar20;
  int *lits;
  ulong uVar21;
  char *pcVar22;
  timespec *ptVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  int Lit;
  int iGVars [4];
  int iTVars [4];
  int pLits [100];
  int pN [102] [2];
  int Me [102] [102];
  timespec *local_a908;
  uint local_a8f4;
  ulong local_a8e0;
  int local_a8ac;
  ulong local_a8a8;
  ulong local_a8a0;
  ulong local_a898;
  int local_a88c;
  ulong local_a888;
  ulong local_a880;
  ulong local_a878;
  ulong local_a870;
  long local_a868;
  ulong local_a860;
  ulong local_a858;
  uint local_a850;
  int local_a84c;
  int local_a848;
  int local_a844;
  int local_a840;
  int local_a83c;
  int local_a838 [4];
  int local_a828 [4];
  ulong local_a818;
  ulong local_a810;
  long local_a808;
  ulong local_a800;
  ulong local_a7f8;
  ulong local_a7f0;
  ulong local_a7e8;
  ulong local_a7e0;
  ulong local_a7d8;
  ulong local_a7d0;
  ulong local_a7c8;
  ulong local_a7c0;
  long local_a7b8;
  long local_a7b0;
  long local_a7a8;
  long local_a7a0;
  ulong local_a798;
  long local_a790;
  timespec local_a788 [24];
  int aiStack_a600 [205];
  int iStack_a2cc;
  timespec local_a2c8 [25];
  int local_a12c;
  int local_40;
  int local_3c;
  
  uVar33 = (ulong)(uint)Y;
  uVar31 = (ulong)(uint)X;
  local_a88c = fVerbose;
  iVar7 = clock_gettime(3,local_a2c8);
  if (iVar7 < 0) {
    local_a868 = -1;
  }
  else {
    local_a868 = local_a2c8[0].tv_nsec / 1000 + local_a2c8[0].tv_sec * 1000000;
  }
  s = satoko_create();
  memset(local_a2c8,0,0xa290);
  memset(aiStack_a600 + 2,0,0x330);
  if (((X < 0x65) && (Y < 0x65)) && (T < 0x65)) {
    pVVar3 = p->vCis;
    uVar15 = pVVar3->nSize;
    local_a8a0 = (ulong)uVar15;
    uVar1 = p->nRegs;
    uVar2 = p->nObjs;
    uVar20 = uVar15 - uVar1;
    local_a888 = (ulong)uVar20;
    uVar16 = p->vCos->nSize;
    local_a878 = (ulong)uVar16;
    uVar16 = ~(uVar16 + uVar15);
    iVar7 = uVar2 + uVar20 + uVar16;
    if (iVar7 < 0x65) {
      if (0 < (int)uVar20) {
        memset(aiStack_a600 + 2,0xff,(ulong)(~uVar1 + uVar15) * 8 + 8);
      }
      if ((0 < (int)uVar2) && (pGVar13 = p->pObjs, pGVar13 != (Gia_Obj_t *)0x0)) {
        lVar17 = -1;
        do {
          uVar4 = *(undefined8 *)pGVar13;
          uVar15 = (uint)uVar4;
          if ((~uVar15 & 0x1fffffff) != 0 && -1 < (int)uVar15) {
            aiStack_a600[lVar17 * 2 + 2] = (int)lVar17 - (uVar15 & 0x1fffffff);
            aiStack_a600[lVar17 * 2 + 3] = (int)lVar17 - ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff)
            ;
          }
          pGVar13 = pGVar13 + 1;
          lVar27 = lVar17 - (ulong)uVar2;
          lVar17 = lVar17 + 1;
        } while (lVar27 != -2);
      }
      local_a808 = (long)(int)local_a888;
      if (local_a88c != 0) {
        printf("The graph has %d inputs: ",(ulong)(pVVar3->nSize - uVar1));
        if (0 < (int)local_a888) {
          iVar18 = uVar1 - (int)local_a8a0;
          uVar15 = 0x61;
          do {
            printf("%c ",(ulong)uVar15);
            iVar19 = iVar18 + uVar15;
            uVar15 = uVar15 + 1;
          } while (iVar19 != 0x60);
        }
        printf("  and %d nodes: ",(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
        lVar17 = local_a808;
        if ((int)local_a888 < iVar7) {
          iVar18 = (int)local_a888 + 0x61;
          lVar27 = 0;
          do {
            printf("%c=%c%c ",(ulong)(uint)(iVar18 + (int)lVar27),
                   (ulong)(aiStack_a600[lVar17 * 2 + lVar27 * 2 + 2] + 0x61),
                   (ulong)(aiStack_a600[lVar17 * 2 + lVar27 * 2 + 3] + 0x61));
            lVar27 = lVar27 + 1;
          } while (uVar16 + uVar2 != (int)lVar27);
        }
        putchar(10);
      }
      if (Y < 1) {
        uVar25 = 0;
      }
      else {
        uVar21 = 0;
        ptVar23 = local_a2c8;
        uVar25 = 0;
        do {
          if (0 < X) {
            lVar17 = 0;
            do {
              *(int *)((long)&ptVar23->tv_sec + lVar17) = (int)uVar25;
              lVar17 = lVar17 + 0x198;
              uVar25 = (ulong)((int)uVar25 + ((uVar2 + T) - ((int)local_a878 + uVar1)) + 0x10);
            } while (uVar31 * 0x198 - lVar17 != 0);
          }
          uVar21 = uVar21 + 1;
          ptVar23 = (timespec *)((long)&ptVar23->tv_sec + 4);
        } while (uVar21 != uVar33);
      }
      local_40 = T;
      local_3c = iVar7;
      if (local_a88c != 0) {
        iVar18 = Y * X;
        printf("SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n"
               ,uVar25,(ulong)(uint)(iVar18 * T),(ulong)(uint)(iVar7 * iVar18),
               (ulong)(uint)(iVar18 * 0x10));
      }
      if (0 < X) {
        local_a880 = (ulong)(Y - 1);
        local_a898 = CONCAT44(local_a898._4_4_,(T + (int)local_a8a0) - uVar1);
        uVar25 = 0;
        local_a8a8 = uVar33;
        do {
          if (0 < Y) {
            uVar21 = 0;
            do {
              iVar18 = *(int *)((long)local_a2c8 + uVar21 * 4 + uVar25 * 0x198);
              if ((uVar25 == 0) || (uVar21 == local_a880 || (uVar21 == 0 || uVar25 == X - 1))) {
                if (0 < T) {
                  iVar19 = iVar18 * 2;
                  iVar28 = 0;
                  do {
                    if (iVar18 < 0) goto LAB_0057ef24;
                    local_a8ac = (iVar19 + 1) - (uint)(iVar28 == 0);
                    iVar8 = satoko_add_clause(s,&local_a8ac,1);
                    if (iVar8 == 0) {
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                    ,0xa8,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                    }
                    iVar28 = iVar28 + 1;
                    iVar19 = iVar19 + 2;
                  } while (T != iVar28);
                }
                if ((int)local_a888 < iVar7) {
                  iVar18 = iVar18 + (int)local_a898;
                  iVar28 = iVar18 * 2 + 1;
                  iVar19 = uVar16 + uVar2;
                  do {
                    if (iVar18 < 0) goto LAB_0057ef24;
                    local_a8ac = iVar28;
                    iVar8 = satoko_add_clause(s,&local_a8ac,1);
                    if (iVar8 == 0) {
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                    ,0xae,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                    }
                    iVar28 = iVar28 + 2;
                    iVar18 = iVar18 + 1;
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                }
              }
              else {
                if (iVar18 < 0) goto LAB_0057ef24;
                local_a8ac = iVar18 * 2 + 1;
                iVar18 = satoko_add_clause(s,&local_a8ac,1);
                if (iVar18 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0xb4,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != local_a8a8);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar31);
      }
      local_a850 = X - 1;
      uVar16 = Y - 1;
      local_a858 = (ulong)uVar16;
      uVar15 = (int)local_a878 + uVar1;
      local_a878 = (ulong)uVar15;
      local_a818 = (ulong)~uVar15;
      local_a848 = 1;
      if (1 < T) {
        local_a848 = T;
      }
      uVar20 = 1;
      if (1 < (int)uVar16) {
        uVar20 = uVar16;
      }
      local_a8f4 = 0;
      local_a7f8 = 1;
      if (1 < (int)local_a850) {
        local_a7f8 = (ulong)local_a850;
      }
      if (SBORROW4(local_a850,2) == X + -3 < 0) {
        local_a7c0 = (ulong)(iVar7 + T + 0x10);
        local_a840 = ~uVar15 + uVar2;
        local_a84c = (int)local_a8a0 * 0xc + uVar1 * -0xc;
        local_a7a8 = (long)iVar7;
        local_a7d0 = (ulong)uVar20;
        local_a844 = (uVar15 - uVar2) + 1;
        local_a7b0 = (ulong)(uint)T * 2;
        local_a7d8 = (ulong)(uVar2 + T);
        iVar18 = (uVar2 + T) - uVar15;
        local_a7c8 = (ulong)(iVar18 - 1);
        local_a7f0 = (ulong)(uVar15 * -2 + 7);
        local_a7e8 = (ulong)~(uVar15 * 2);
        local_a7e0 = (ulong)(iVar18 + 3);
        local_a8f4 = 0;
        uVar25 = 1;
        do {
          local_a810 = uVar25 + 1;
          if (1 < (int)local_a858) {
            uVar21 = 1;
            local_a7b8 = (long)local_a2c8 + (uVar25 - 1) * 0x198;
            local_a800 = uVar25;
            do {
              uVar15 = *(uint *)((long)local_a2c8 + uVar21 * 4 + uVar25 * 0x198);
              local_a870 = (ulong)uVar15;
              iVar19 = uVar15 + T;
              iVar18 = (int)local_a7c0 + uVar15;
              local_a828[0] = *(int *)(local_a7b8 + uVar21 * 4);
              local_a838[0] = local_a828[0] + T;
              local_a828[1] = (&iStack_a2cc)[uVar25 * 0x66 + uVar21];
              local_a838[1] = (&iStack_a2cc)[uVar25 * 0x66 + uVar21] + T;
              local_a828[2] = *(int *)((long)local_a2c8 + uVar21 * 4 + local_a810 * 0x198);
              local_a838[2] = local_a828[2] + T;
              local_a828[3] = *(int *)((long)local_a2c8 + uVar21 * 4 + uVar25 * 0x198 + 4);
              local_a838[3] = local_a828[3] + T;
              local_a860 = uVar21;
              if (0 < iVar7) {
                iVar30 = iVar19 * 2 + 1;
                iVar8 = 0;
                iVar28 = iVar19;
                do {
                  if ((iVar28 < 0) || (local_a788[0].tv_sec._0_4_ = iVar30, iVar18 < 0))
                  goto LAB_0057ef24;
                  local_a788[0].tv_sec._4_4_ = iVar18 * 2;
                  iVar9 = satoko_add_clause(s,(int *)local_a788,2);
                  if (iVar9 == 0) {
                    __assert_fail("RetValue",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                  ,0xd6,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                  }
                  iVar8 = iVar8 + -1;
                  iVar30 = iVar30 + 2;
                  iVar28 = iVar28 + 1;
                } while (local_a844 != iVar8);
                local_a8f4 = local_a8f4 - iVar8;
              }
              uVar32 = local_a860;
              if (iVar18 < 0) goto LAB_0057ef24;
              iVar18 = iVar18 * 2 + 1;
              local_a788[0].tv_sec._0_4_ = iVar18;
              if (1 < T) {
                lVar17 = 2;
                do {
                  if ((int)local_a870 + 1 < 0) goto LAB_0057ef24;
                  *(int *)((long)&local_a788[0].tv_sec + lVar17 * 2) =
                       (int)local_a870 * 2 + (int)lVar17;
                  lVar17 = lVar17 + 2;
                } while (local_a7b0 != lVar17);
              }
              iVar28 = satoko_add_clause(s,(int *)local_a788,T);
              if (iVar28 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                              ,0xde,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
              }
              local_a8a8 = (ulong)(uint)(iVar7 + iVar19);
              iVar8 = (int)local_a7c8 + (int)local_a870;
              iVar28 = iVar8 * 2;
              lVar17 = 0;
              do {
                local_a788[0].tv_sec._0_4_ = iVar18;
                if (iVar7 + iVar19 + (int)lVar17 < 0) goto LAB_0057ef24;
                *(int *)((long)&local_a788[0].tv_sec + lVar17 * 4 + 4) = iVar28;
                lVar17 = lVar17 + 1;
                iVar28 = iVar28 + 2;
              } while (lVar17 != 0x10);
              iVar18 = satoko_add_clause(s,(int *)local_a788,0x11);
              if (iVar18 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                              ,0xe5,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
              }
              local_a8f4 = local_a8f4 + 2;
              uVar21 = uVar32 + 1;
              if (1 < T) {
                local_a7a0 = (long)iVar19;
                iVar30 = (int)local_a870;
                iVar18 = (int)local_a7d8 + iVar30;
                local_a83c = (int)local_a7e8 + iVar18 * 2;
                local_a8a0 = CONCAT44(local_a8a0._4_4_,(int)local_a7f0 + iVar18 * 2);
                iVar28 = (int)local_a7e0;
                iVar18 = 1;
                local_a860 = uVar32 + 1;
                do {
                  if (0 < iVar7) {
                    if (iVar18 + (int)local_a870 < 0) goto LAB_0057ef24;
                    iVar9 = (iVar18 + (int)local_a870) * 2 + 1;
                    iVar29 = 0;
                    do {
                      iVar24 = (iVar29 + iVar19) * 2 + 1;
                      local_a8f4 = local_a8f4 + 8;
                      lVar17 = 0;
                      iVar26 = local_a83c;
                      do {
                        local_a788[0].tv_sec._0_4_ = iVar9;
                        if ((iVar29 + iVar19 < 0) ||
                           (local_a788[0].tv_sec._4_4_ = iVar24, (int)local_a8a8 + (int)lVar17 < 0))
                        goto LAB_0057ef24;
                        local_a788[0].tv_nsec._0_4_ = iVar26;
                        iVar10 = local_a828[lVar17] + iVar18;
                        if (iVar10 == 0 || SCARRY4(local_a828[lVar17],iVar18) != iVar10 < 0)
                        goto LAB_0057ef24;
                        local_a788[0].tv_nsec._4_4_ = iVar10 * 2 + -2;
                        iVar10 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar10 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0xf5,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                        }
                        local_a788[0].tv_sec._0_4_ = iVar9;
                        local_a788[0].tv_sec._4_4_ = iVar24;
                        local_a788[0].tv_nsec._0_4_ = iVar26;
                        if (local_a838[lVar17] + iVar29 < 0) goto LAB_0057ef24;
                        local_a788[0].tv_nsec._4_4_ = (local_a838[lVar17] + iVar29) * 2;
                        iVar10 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar10 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0xfc,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                        }
                        lVar17 = lVar17 + 1;
                        iVar26 = iVar26 + 2;
                      } while (lVar17 != 4);
                      iVar29 = iVar29 + 1;
                    } while (iVar29 != local_a840);
                  }
                  iVar9 = (int)local_a888;
                  if (0 < iVar9) {
                    local_a8f4 = local_a8f4 + local_a84c;
                    iVar29 = 0;
                    do {
                      if (iVar29 + iVar19 < 0) goto LAB_0057ef24;
                      iVar26 = (iVar29 + iVar19) * 2 + 1;
                      iVar24 = 0;
                      uVar25 = local_a8a0 & 0xffffffff;
                      do {
                        local_a788[0].tv_sec._0_4_ = iVar26;
                        if (iVar28 + iVar30 + iVar24 < 0) goto LAB_0057ef24;
                        local_a788[0].tv_sec._4_4_ = (int)uVar25;
                        iVar10 = satoko_add_clause(s,(int *)local_a788,2);
                        if (iVar10 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x105,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        iVar24 = iVar24 + 1;
                        uVar25 = (ulong)((int)uVar25 + 2);
                      } while (iVar24 != 0xc);
                      iVar29 = iVar29 + 1;
                    } while (iVar29 != iVar9);
                  }
                  if (iVar9 < iVar7) {
                    uVar15 = (int)local_a870 + iVar18;
                    local_a798 = (ulong)uVar15;
                    iVar9 = uVar15 * 2 + 1;
                    lVar17 = local_a808;
                    do {
                      iVar29 = aiStack_a600[lVar17 * 2 + 2];
                      if (iVar29 < 0) {
LAB_0057f46c:
                        __assert_fail("pN[g][0] >= 0 && pN[g][1] >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                      ,0x10c,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                      }
                      local_a898 = CONCAT44(local_a898._4_4_,aiStack_a600[lVar17 * 2 + 3]);
                      if (aiStack_a600[lVar17 * 2 + 3] < 0) goto LAB_0057f46c;
                      if ((int)local_a798 < 0) goto LAB_0057ef24;
                      local_a790 = lVar17;
                      local_a880 = local_a7a0 + lVar17;
                      iVar24 = (int)local_a880 * 2 + 1;
                      local_a8f4 = local_a8f4 + 0x30;
                      lVar17 = 0;
                      iVar26 = (int)local_a8a0;
                      do {
                        local_a788[0].tv_sec._0_4_ = iVar9;
                        if (((long)local_a880 < 0) ||
                           (local_a788[0].tv_sec._4_4_ = iVar24, iVar8 + lVar17 < -4))
                        goto LAB_0057ef24;
                        local_a788[0].tv_nsec._0_4_ = iVar26;
                        iVar10 = (&DAT_009b9210)[lVar17 * 2];
                        iVar11 = local_a828[iVar10] + iVar18;
                        if (iVar11 == 0 || SCARRY4(local_a828[iVar10],iVar18) != iVar11 < 0)
                        goto LAB_0057ef24;
                        local_a788[0].tv_nsec._4_4_ = iVar11 * 2 + -2;
                        iVar11 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar11 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x113,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        local_a788[0].tv_sec._0_4_ = iVar9;
                        local_a788[0].tv_sec._4_4_ = iVar24;
                        local_a788[0].tv_nsec._0_4_ = iVar26;
                        iVar11 = (&DAT_009b9214)[lVar17 * 2];
                        iVar12 = local_a828[iVar11] + iVar18;
                        if (iVar12 == 0 || SCARRY4(local_a828[iVar11],iVar18) != iVar12 < 0)
                        goto LAB_0057ef24;
                        local_a788[0].tv_nsec._4_4_ = iVar12 * 2 + -2;
                        iVar12 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar12 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x11a,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        local_a788[0].tv_sec._0_4_ = iVar9;
                        local_a788[0].tv_sec._4_4_ = iVar24;
                        local_a788[0].tv_nsec._0_4_ = iVar26;
                        iVar10 = local_a838[iVar10] + iVar29;
                        if (iVar10 < 0) goto LAB_0057ef24;
                        local_a788[0].tv_nsec._4_4_ = iVar10 * 2;
                        iVar10 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar10 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x122,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        local_a788[0].tv_sec._0_4_ = iVar9;
                        local_a788[0].tv_sec._4_4_ = iVar24;
                        local_a788[0].tv_nsec._0_4_ = iVar26;
                        if (local_a838[iVar11] + (int)local_a898 < 0) goto LAB_0057ef24;
                        local_a788[0].tv_nsec._4_4_ = (local_a838[iVar11] + (int)local_a898) * 2;
                        iVar10 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar10 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x129,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        lVar17 = lVar17 + 1;
                        iVar26 = iVar26 + 2;
                      } while (lVar17 != 0xc);
                      lVar17 = local_a790 + 1;
                    } while (lVar17 < local_a7a8);
                  }
                  iVar18 = iVar18 + 1;
                  uVar25 = local_a800;
                  uVar21 = local_a860;
                } while (iVar18 != local_a848);
              }
            } while (uVar21 != local_a7d0);
          }
          uVar25 = local_a810;
        } while (local_a810 != local_a7f8);
      }
      local_a898 = (ulong)(uint)(iVar7 + T);
      local_a12c = local_a12c + iVar7 + T;
      if (local_a12c < 1) {
LAB_0057ef24:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      local_a8ac = local_a12c * 2 + -2;
      lits = &local_a8ac;
      iVar18 = satoko_add_clause(s,lits,1);
      if (iVar18 == 0) {
        printf("Problem has no solution. ");
        aVar14 = Abc_Clock();
        Abc_PrintTime((int)aVar14 - (int)local_a868,(char *)lits,time);
      }
      else {
        if (local_a88c != 0) {
          printf("Finished adding %d clauses. Started solving...\n",(ulong)local_a8f4);
        }
        local_a8a8 = (ulong)local_a850;
        uVar25 = uVar33;
        local_a880 = uVar33;
        while (iVar18 = satoko_solve(s), iVar18 == 1) {
          if (X < 1) {
            uVar15 = 0;
          }
          else {
            uVar21 = 0;
            local_a908 = local_a2c8;
            uVar15 = 0;
            do {
              if (0 < Y) {
                uVar32 = 0;
                do {
                  if ((uVar21 == 0) ||
                     (local_a858 == uVar32 || (uVar32 == 0 || uVar21 == local_a8a8))) {
                    iVar19 = *(int *)((long)&local_a908->tv_sec + uVar32 * 4) + T;
                    iVar19 = Bmc_MeshAddOneHotness(s,iVar19,iVar19 + iVar7);
                    uVar15 = uVar15 + iVar19;
                  }
                  else {
                    iVar19 = *(int *)((long)&local_a908->tv_sec + uVar32 * 4);
                    iVar8 = iVar19 + T;
                    iVar19 = Bmc_MeshAddOneHotness(s,iVar19,iVar8);
                    iVar28 = Bmc_MeshAddOneHotness(s,iVar8,iVar8 + iVar7);
                    iVar8 = Bmc_MeshAddOneHotness(s,iVar8 + iVar7,iVar7 + iVar8 + 0x10);
                    uVar15 = iVar8 + iVar28 + iVar19 + uVar15;
                    uVar25 = local_a880;
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar25 != uVar32);
              }
              uVar21 = uVar21 + 1;
              local_a908 = (timespec *)&local_a908[0x19].tv_nsec;
            } while (uVar21 != uVar31);
          }
          if ((int)uVar15 < 1) {
            pcVar22 = "Satisfying solution found. ";
            goto LAB_0057efcf;
          }
          printf("Adding %d one-hotness clauses.\n",(ulong)uVar15);
        }
        if (iVar18 == -1) {
          pcVar22 = "Problem has no solution. ";
        }
        else {
          pcVar22 = "Computation timed out. ";
          if (iVar18 != 0) {
            __assert_fail("status == SATOKO_SAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                          ,0x14f,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
          }
        }
LAB_0057efcf:
        printf(pcVar22);
        iVar28 = 3;
        iVar19 = clock_gettime(3,local_a788);
        if (iVar19 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = CONCAT44(local_a788[0].tv_nsec._4_4_,(int)local_a788[0].tv_nsec) / 1000 +
                   CONCAT44(local_a788[0].tv_sec._4_4_,(int)local_a788[0].tv_sec) * 1000000;
        }
        lVar17 = lVar17 - local_a868;
        iVar19 = 0;
        Abc_Print(iVar28,"%s =","Time");
        Abc_Print(iVar28,"%9.2f sec\n",(double)lVar17 / 1000000.0);
        if (iVar18 == 1) {
          uVar25 = 0;
          if (2 < Y) {
            uVar21 = local_a858 & 0xffffffff;
            iVar18 = (T + uVar2) - (int)local_a878;
            uVar25 = 0;
            local_a8e0 = 1;
            iVar19 = 0;
            do {
              if (2 < X) {
                uVar32 = 1;
                do {
                  iVar28 = *(int *)((long)local_a2c8 + local_a8e0 * 4 + uVar32 * 0x198);
                  iVar8 = (int)local_a898;
                  iVar30 = 0;
                  do {
                    cVar6 = satoko_var_polarity(s,iVar30 + iVar8 + iVar28);
                    iVar19 = iVar19 + (uint)(cVar6 == '\0');
                    iVar30 = iVar30 + 1;
                  } while (iVar30 != 4);
                  iVar8 = 0;
                  do {
                    cVar6 = satoko_var_polarity(s,iVar28 + iVar18 + 3 + iVar8);
                    uVar25 = (ulong)((int)uVar25 + (uint)(cVar6 == '\0'));
                    iVar8 = iVar8 + 1;
                  } while (iVar8 != 0xc);
                  uVar32 = uVar32 + 1;
                } while (uVar32 != local_a8a8);
              }
              local_a8e0 = local_a8e0 + 1;
            } while (local_a8e0 != uVar21);
          }
          printf("The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n"
                 ,uVar31,uVar33,(ulong)(uint)T,(ulong)(uint)(iVar19 + (int)uVar25),uVar25,iVar19);
          printf(" Y\\X ");
          if (0 < X) {
            uVar15 = 0;
            do {
              printf("  %-2d ",(ulong)uVar15);
              uVar15 = uVar15 + 1;
            } while (X != uVar15);
          }
          putchar(10);
          iVar18 = local_40;
          if (0 < Y) {
            iVar19 = uVar2 + (int)local_a818;
            uVar25 = local_a858 & 0xffffffff;
            uVar33 = 0;
            do {
              printf(" %-2d  ",uVar33 & 0xffffffff);
              if (0 < X) {
                uVar21 = 0;
                local_a898 = uVar33;
                do {
                  if (T < 1) {
LAB_0057f2d5:
                    pcVar22 = "     ";
                    if ((uVar21 == local_a8a8 || uVar33 == 0) || uVar33 == uVar25) {
                      pcVar22 = "  *  ";
                    }
                    if (uVar21 == 0) {
                      pcVar22 = "  *  ";
                    }
                    printf(pcVar22);
                  }
                  else {
                    iVar28 = *(int *)((long)local_a2c8 + uVar33 * 4 + uVar21 * 0x198);
                    bVar5 = false;
                    uVar15 = 0;
                    do {
                      if (0 < iVar7) {
                        iVar8 = 0;
                        do {
                          cVar6 = satoko_var_polarity(s,uVar15 + iVar28);
                          if ((cVar6 == '\0') &&
                             (cVar6 = satoko_var_polarity(s,iVar8 + iVar18 + iVar28), cVar6 == '\0')
                             ) {
                            printf(" %c%-2d ",(ulong)(iVar8 + 0x61),(ulong)uVar15);
                            bVar5 = true;
                          }
                          iVar8 = iVar8 + 1;
                        } while (iVar19 != iVar8);
                      }
                      uVar15 = uVar15 + 1;
                    } while (uVar15 != T);
                    uVar33 = local_a898;
                    if (!bVar5) goto LAB_0057f2d5;
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar31);
              }
              putchar(10);
              uVar33 = uVar33 + 1;
            } while (uVar33 != local_a880);
          }
        }
      }
      satoko_destroy(s);
      return;
    }
  }
  __assert_fail("X <= 100 && Y <= 100 && T <= 100 && G <= 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                ,0x75,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
}

Assistant:

void Bmc_MeshTest( Gia_Man_t * p, int X, int Y, int T, int fVerbose )
{
    abctime clk = Abc_Clock();
    satoko_t * pSat = satoko_create();
    Gia_Obj_t * pObj;
    int Me[102][102] = {{0}};
    int pN[102][2] = {{0}};
    int I = Gia_ManPiNum(p);
    int G = I + Gia_ManAndNum(p);
    int i, x, y, t, g, c, status, RetValue, Lit, iVar, nClauses = 0;

    assert( X <= 100 && Y <= 100 && T <= 100 && G <= 100 );

    // init the graph
    for ( i = 0; i < I; i++ )
        pN[i][0] = pN[i][1] = -1;
    Gia_ManForEachAnd( p, pObj, i )
    {
        pN[i-1][0] = Gia_ObjFaninId0(pObj, i)-1;
        pN[i-1][1] = Gia_ObjFaninId1(pObj, i)-1;
    }
    if ( fVerbose )
    {
        printf( "The graph has %d inputs: ", Gia_ManPiNum(p) );
        for ( i = 0; i < I; i++ )
            printf( "%c ", 'a' + i );
        printf( "  and %d nodes: ", Gia_ManAndNum(p) );
        for ( i = I; i < G; i++ )
            printf( "%c=%c%c ", 'a' + i, 'a' + pN[i][0] , 'a' + pN[i][1] );
        printf( "\n" );
    }

    // init SAT variables (time vars + graph vars + config vars)
    // config variables: 16 = 4 buff vars + 12 node vars
    iVar = 0;
    for ( y = 0; y < Y; y++ )
    for ( x = 0; x < X; x++ )
    {
        //printf( "%3d %3d %3d    %s", iVar, iVar+T, iVar+T+G, x == X-1 ? "\n":"" );
        Me[x][y] = iVar;
        iVar += T + G + NCPARS + 1;
    }
    Me[101][100] = T;
    Me[101][101] = G;
    if ( fVerbose )
        printf( "SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n", iVar, X*Y*T, X*Y*G, X*Y*NCPARS, X*Y );

    // add constraints

    // time 0 and primary inputs only on the boundary
    for ( x = 0; x < X; x++ )
    for ( y = 0; y < Y; y++ )
    {
        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );

        if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
        {
            // time 0 is required
            for ( t = 0; t < T; t++ )
            {
                Lit = Abc_Var2Lit( iTVar+t, (int)(t > 0) );
                RetValue = satoko_add_clause( pSat, &Lit, 1 );  assert( RetValue );
            }
            // internal nodes are not allowed
            for ( g = I; g < G; g++ )
            {
                Lit = Abc_Var2Lit( iGVar+g, 1 );
                RetValue = satoko_add_clause( pSat, &Lit, 1 );  assert( RetValue );
            }
        }
        else // not a boundary
        {
            Lit = Abc_Var2Lit( iTVar, 1 );  // cannot have time 0
            RetValue = satoko_add_clause( pSat, &Lit, 1 );  assert( RetValue );
        }
    }
    for ( x = 1; x < X-1; x++ )
    for ( y = 1; y < Y-1; y++ )
    {
        int pLits[100], nLits;

        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );
        int iCVar = Bmc_MeshCVar( Me, x, y );
        int iUVar = Bmc_MeshUVar( Me, x, y );

        // 0=left  1=up  2=right  3=down
        int iTVars[4]; 
        int iGVars[4];

        iTVars[0] = Bmc_MeshTVar( Me, x-1, y );
        iGVars[0] = Bmc_MeshGVar( Me, x-1, y );

        iTVars[1] = Bmc_MeshTVar( Me, x, y-1 );
        iGVars[1] = Bmc_MeshGVar( Me, x, y-1 );

        iTVars[2] = Bmc_MeshTVar( Me, x+1, y );
        iGVars[2] = Bmc_MeshGVar( Me, x+1, y );

        iTVars[3] = Bmc_MeshTVar( Me, x, y+1 );
        iGVars[3] = Bmc_MeshGVar( Me, x, y+1 );

        // condition when cell is used
        for ( g = 0; g < G; g++ )
        {
            pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
            pLits[1] = Abc_Var2Lit( iUVar, 0 );
            RetValue = satoko_add_clause( pSat, pLits, 2 );  assert( RetValue );
            nClauses++;
        }

        // at least one time is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( t = 1; t < T; t++ )
            pLits[t] = Abc_Var2Lit( iTVar+t, 0 );
        RetValue = satoko_add_clause( pSat, pLits, T );  assert( RetValue );
        nClauses++;

        // at least one config is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( c = 0; c < NCPARS; c++ )
            pLits[c+1] = Abc_Var2Lit( iCVar+c, 0 );
        RetValue = satoko_add_clause( pSat, pLits, NCPARS+1 );  assert( RetValue );
        nClauses++;

        // constraints for each time
        for ( t = 1; t < T; t++ )
        {
            int Conf[12][2] = {{0, 1}, {0, 2}, {0, 3}, {1, 2}, {1, 3}, {2, 3},   {1, 0}, {2, 0}, {3, 0}, {2, 1}, {3, 1}, {3, 2}};
            // buffer
            for ( g = 0; g < G; g++ )
            for ( c = 0; c < 4; c++ )
            {
                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[c]+t-1, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[c]+g, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nClauses += 2;
            }
            for ( g = 0; g < I; g++ )
            for ( c = 4; c < NCPARS; c++ )
            {
                pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[1] = Abc_Var2Lit( iCVar+c, 1 );
                RetValue = satoko_add_clause( pSat, pLits, 2 );  assert( RetValue );
                nClauses++;
            }
            // node
            for ( g = I; g < G; g++ )
            for ( c = 0; c < 12; c++ )
            {
                assert( pN[g][0] >= 0 && pN[g][1] >= 0 );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][0]]+t-1, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][1]]+t-1, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );


                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][0]]+pN[g][0], 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][1]]+pN[g][1], 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nClauses += 4;
            }
        }
    }

    // final condition
    {
        int iGVar = Bmc_MeshGVar( Me, 1, 1 ) + G-1;
        Lit = Abc_Var2Lit( iGVar, 0 );
        RetValue = satoko_add_clause( pSat, &Lit, 1 );  
        if ( RetValue == 0 )
        {
            printf( "Problem has no solution. " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            satoko_destroy( pSat );
            return;
        }
    }

    if ( fVerbose )
        printf( "Finished adding %d clauses. Started solving...\n", nClauses );

    while ( 1 )
    {
        int nAddClauses = 0;
        status = satoko_solve( pSat );
        if ( status == SATOKO_UNSAT )
        {
            printf( "Problem has no solution. " );
            break;
        }
        if ( status == SATOKO_UNDEC )
        {
            printf( "Computation timed out. " );
            break;
        }
        assert( status == SATOKO_SAT );
        // check if the solution is valid and add constraints
        for ( x = 0; x < X; x++ )
        for ( y = 0; y < Y; y++ )
        {
            if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
            {
                int iGVar = Bmc_MeshGVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iGVar, iGVar + G );
            }
            else
            {
                int iTVar = Bmc_MeshTVar( Me, x, y );
                int iGVar = Bmc_MeshGVar( Me, x, y );
                int iCVar = Bmc_MeshCVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iTVar, iTVar + T );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iGVar, iGVar + G );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iCVar, iCVar + NCPARS );
            }
        }
        if ( nAddClauses > 0 )
        {
            printf( "Adding %d one-hotness clauses.\n", nAddClauses );
            continue;
        }
        printf( "Satisfying solution found. " );
/*
        iVar = satoko_varnum(pSat);
        for ( i = 0; i < iVar; i++ )
            if ( Bmc_MeshVarValue(pSat, i) )
                printf( "%d ", i );
        printf( "\n" );
*/
        break;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( status == SATOKO_SAT )
    {
        // count the number of nodes and buffers
        int nBuffs = 0, nNodes = 0;
        for ( y = 1; y < Y-1; y++ )
        for ( x = 1; x < X-1; x++ )
        {
            int iCVar = Bmc_MeshCVar( Me, x, y );
            for ( c = 0; c < 4; c++ )
                if ( Bmc_MeshVarValue(pSat, iCVar+c) )
                {
                    //printf( "Buffer y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nBuffs++;
                }
            for ( c = 4; c < NCPARS; c++ )
                if ( Bmc_MeshVarValue(pSat, iCVar+c) )
                {
                    //printf( "Node   y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nNodes++;
                }
        }
        printf( "The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n", X, Y, T, nNodes+nBuffs, nNodes, nBuffs );
        // print mesh
        printf( " Y\\X " );
        for ( x = 0; x < X; x++ )
            printf( "  %-2d ", x );
        printf( "\n" );
        for ( y = 0; y < Y; y++ )
        {
            printf( " %-2d  ", y );
            for ( x = 0; x < X; x++ )
            {
                int iTVar  = Bmc_MeshTVar( Me, x, y );
                int iGVar  = Bmc_MeshGVar( Me, x, y );

                int fFound = 0;                ;
                for ( t = 0; t < T; t++ )
                for ( g = 0; g < G; g++ )
                    if ( Bmc_MeshVarValue(pSat, iTVar+t) && Bmc_MeshVarValue(pSat, iGVar+g) )
                    {
                        printf( " %c%-2d ", 'a' + g, t );
                        fFound = 1;
                    }
                if ( fFound )
                    continue;
                if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
                    printf( "  *  " );
                else
                    printf( "     " );
            }
            printf( "\n" );
        }
    }
    satoko_destroy( pSat );
}